

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

TldAsKey * __thiscall
BinHash<TldAsKey>::DoInsert(BinHash<TldAsKey> *this,TldAsKey *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  size_t __n;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  TldAsKey **ppTVar5;
  size_t sVar6;
  TldAsKey *pTVar7;
  TldAsKey *pTVar8;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 == 0 || key == (TldAsKey *)0x0) {
LAB_00163e97:
    key = (TldAsKey *)0x0;
  }
  else {
    uVar3 = key->hash;
    if (uVar3 == 0) {
      key->hash = 0xbabac001;
      uVar3 = 0xbabac001;
      if (key->tld_len != 0) {
        sVar6 = 0;
        do {
          uVar3 = (uint)key->tld[sVar6] + uVar3 * 0x65;
          key->hash = uVar3;
          sVar6 = sVar6 + 1;
        } while (key->tld_len != sVar6);
      }
    }
    uVar2 = (ulong)uVar3 % (ulong)uVar1;
    ppTVar5 = this->hashBin;
    pTVar7 = ppTVar5[uVar2];
    if (pTVar7 != (TldAsKey *)0x0) {
      __n = key->tld_len;
      pTVar8 = pTVar7;
      do {
        if ((__n == pTVar8->tld_len) && (iVar4 = bcmp(key->tld,pTVar8->tld,__n), iVar4 == 0)) {
          if (pTVar8->max_name_parts < key->max_name_parts) {
            pTVar8->max_name_parts = key->max_name_parts;
          }
          pTVar8->count = pTVar8->count + key->count;
          *stored = false;
          return pTVar8;
        }
        pTVar8 = pTVar8->HashNext;
      } while (pTVar8 != (TldAsKey *)0x0);
    }
    if (need_alloc) {
      key = TldAsKey::CreateCopy(key);
      if (key == (TldAsKey *)0x0) goto LAB_00163e97;
      ppTVar5 = this->hashBin;
      pTVar7 = ppTVar5[uVar2];
    }
    key->HashNext = pTVar7;
    ppTVar5[uVar2] = key;
    *stored = true;
    this->tableCount = this->tableCount + 1;
  }
  return key;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }